

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall QMenuBar::mouseMoveEvent(QMenuBar *this,QMouseEvent *e)

{
  QMenuBarPrivate *this_00;
  bool bVar1;
  int iVar2;
  QPoint p;
  QAction *action;
  bool popup;
  long in_FS_OFFSET;
  QPointF local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
  if (((byte)e[0x44] & 1) == 0) {
    this_00->field_0x298 = this_00->field_0x298 & 0xfe;
    iVar2 = QMouseEvent::source();
    if (iVar2 != 0) goto LAB_0042dc8e;
  }
  popup = true;
  if ((this_00->field_0x2a0 & 1) == 0) {
    popup = (bool)(this_00->field_0x298 & 1);
  }
  local_30 = QSinglePointEvent::position((QSinglePointEvent *)e);
  p = QPointF::toPoint(&local_30);
  action = QMenuBarPrivate::actionAt(this_00,p);
  if (action == (QAction *)0x0) {
    if (popup != false) goto LAB_0042dc8e;
  }
  else {
    bVar1 = QMenuBarPrivate::isVisible(this_00,action);
    if ((!bVar1) && (popup == true)) goto LAB_0042dc8e;
  }
  QMenuBarPrivate::setCurrentAction(this_00,action,popup,false);
LAB_0042dc8e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBar::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QMenuBar);
    if (!(e->buttons() & Qt::LeftButton)) {
        d->mouseDown = false;
        // We receive mouse move and mouse press on touch.
        // Mouse move will open the menu and mouse press
        // will close it, so ignore mouse move.
        if (e->source() != Qt::MouseEventNotSynthesized)
            return;
    }

    bool popupState = d->popupState || d->mouseDown;
    QAction *action = d->actionAt(e->position().toPoint());
    if ((action && d->isVisible(action)) || !popupState)
        d->setCurrentAction(action, popupState);
}